

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

Error * ot::commissioner::BbrDatasetFromJson
                  (Error *__return_storage_ptr__,BbrDataset *aDataset,string *aJson)

{
  char *begin;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  Json json;
  undefined1 local_100 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8 [4];
  string local_d8;
  undefined1 local_b8 [64];
  _Alloc_hider local_78;
  size_type sStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined8 local_58;
  _Any_data local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  local_b8._0_8_ = local_b8 + 0x10;
  local_b8._40_8_ = (parse_func)0x0;
  local_b8._56_8_ = 0;
  sStack_70 = 0;
  local_68._8_8_ = 0;
  local_b8._16_8_ = 0;
  local_b8._24_8_ = 0;
  local_58._0_2_ = 0;
  local_58._2_6_ = 0;
  local_b8._8_8_ = (char *)0x0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_b8._32_8_ = local_b8 + 0x30;
  local_b8._48_8_ = 0;
  local_78._M_p = (pointer)&local_68;
  local_68._M_allocated_capacity = 0;
  BbrDataset::operator=(aDataset,(BbrDataset *)local_b8);
  BbrDataset::~BbrDataset((BbrDataset *)local_b8);
  StripComments((string *)local_b8,aJson);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((input_adapter *)local_100,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse(&json,(input_adapter *)local_100,(parser_callback_t *)&local_48,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_f8);
  std::__cxx11::string::~string((string *)local_b8);
  if (json.m_type == null) {
    local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
    local_b8._8_8_ = "Empty BBR dataset from JSON";
    local_b8._16_8_ = 0x1b;
    local_b8._24_8_ = 0;
    local_b8._40_8_ = (parse_func)0x0;
    pcVar1 = "Empty BBR dataset from JSON";
    local_b8._32_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_b8;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_b8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_b8;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_d8,(v10 *)"Empty BBR dataset from JSON",(string_view)ZEXT816(0x1b),args);
    local_100._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)local_f8,(string *)&local_d8);
    Error::operator=(__return_storage_ptr__,(Error *)local_100);
    std::__cxx11::string::~string((string *)local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  else {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<ot::commissioner::BbrDataset,_ot::commissioner::BbrDataset,_0>
              ((BbrDataset *)local_b8,&json);
    BbrDataset::operator=(aDataset,(BbrDataset *)local_b8);
    BbrDataset::~BbrDataset((BbrDataset *)local_b8);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&json);
  return __return_storage_ptr__;
}

Assistant:

Error BbrDatasetFromJson(BbrDataset &aDataset, const std::string &aJson)
{
    Error error;

    aDataset = BbrDataset{};

    try
    {
        Json json = Json::parse(StripComments(aJson));
        if (json.is_null())
        {
            error = ERROR_NOT_FOUND("Empty BBR dataset from JSON");
        }
        else
        {
            aDataset = json;
        }
    } catch (JsonException &e)
    {
        error = e.GetError();
    } catch (std::exception &e)
    {
        error = {ErrorCode::kInvalidArgs, e.what()};
    }

    return error;
}